

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass-utils.h
# Opt level: O2

void __thiscall
wasm::PassUtils::FilteredPass::runOnFunction(FilteredPass *this,Module *module,Function *func)

{
  Pass *pPVar1;
  size_type sVar2;
  Function *local_20;
  Function *func_local;
  
  local_20 = func;
  sVar2 = std::
          _Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&this->relevantFuncs->_M_h,&local_20);
  if (sVar2 != 0) {
    Pass::setPassRunner((this->pass)._M_t.
                        super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                        super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                        super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl,
                        (this->super_Pass).runner);
    pPVar1 = (this->pass)._M_t.super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
             super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
    (*pPVar1->_vptr_Pass[3])(pPVar1,module,local_20);
  }
  return;
}

Assistant:

void runOnFunction(Module* module, Function* func) override {
    if (!relevantFuncs.count(func)) {
      return;
    }

    // The pass runner calling us set our pass runner, which we must do for the
    // wrapped pass.
    pass->setPassRunner(getPassRunner());
    pass->runOnFunction(module, func);
  }